

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void rc::detail::checkGTest<void(*)()>(_func_void **testable)

{
  ulong *puVar1;
  char cVar2;
  UnitTest *this;
  TestInfo *pTVar3;
  long *plVar4;
  ulong *puVar5;
  TestMetadata *args;
  ulong uVar6;
  TestMetadata metadata;
  TestResult result;
  ostringstream ss;
  allocator<char> local_2f1;
  AssertHelper local_2f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e8;
  long local_2e0;
  ulong local_2d8 [2];
  long *local_2c8;
  long local_2c0;
  long local_2b8 [2];
  _func_void *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined1 local_268 [192];
  undefined1 local_1a8 [16];
  TestMetadata local_198;
  ios_base local_138 [264];
  
  this = testing::UnitTest::GetInstance();
  pTVar3 = testing::UnitTest::current_test_info(this);
  local_2a8 = (_func_void *)&local_298;
  local_2a0 = 0;
  local_298 = (_func_void)0x0;
  local_280 = 0;
  local_278 = 0;
  local_288 = &local_278;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,(pTVar3->test_suite_name_)._M_dataplus._M_p,
             (allocator<char> *)&local_2f0);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  puVar1 = (ulong *)(local_268 + 0x10);
  puVar5 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar5) {
    local_268._16_8_ = *puVar5;
    local_268._24_8_ = plVar4[3];
    local_268._0_8_ = puVar1;
  }
  else {
    local_268._16_8_ = *puVar5;
    local_268._0_8_ = (ulong *)*plVar4;
  }
  local_268._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar4 + 1);
  *plVar4 = (long)puVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,(pTVar3->name_)._M_dataplus._M_p,&local_2f1);
  uVar6 = 0xf;
  if ((ulong *)local_268._0_8_ != puVar1) {
    uVar6 = local_268._16_8_;
  }
  if (uVar6 < (ulong)(local_2e0 + local_268._8_8_)) {
    uVar6 = 0xf;
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8) {
      uVar6 = local_2d8[0];
    }
    if ((ulong)(local_2e0 + local_268._8_8_) <= uVar6) {
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_2e8,0,(char *)0x0,local_268._0_8_);
      goto LAB_0012c1e8;
    }
  }
  plVar4 = (long *)std::__cxx11::string::_M_append(local_268,(ulong)local_2e8._M_head_impl);
LAB_0012c1e8:
  local_1a8._0_8_ = &local_198;
  args = (TestMetadata *)(plVar4 + 2);
  if ((TestMetadata *)*plVar4 == args) {
    local_198.id._M_dataplus._M_p = (args->id)._M_dataplus._M_p;
    local_198.id._M_string_length = plVar4[3];
  }
  else {
    local_198.id._M_dataplus._M_p = (args->id)._M_dataplus._M_p;
    local_1a8._0_8_ = (TestMetadata *)*plVar4;
  }
  local_1a8._8_8_ = plVar4[1];
  *plVar4 = (long)args;
  plVar4[1] = 0;
  *(undefined1 *)&(args->id)._M_dataplus._M_p = 0;
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
  if ((TestMetadata *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198.id._M_dataplus._M_p + 1));
  }
  if (local_2e8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8) {
    operator_delete(local_2e8._M_head_impl,local_2d8[0] + 1);
  }
  if ((ulong *)local_268._0_8_ != puVar1) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8,local_2b8[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,(pTVar3->name_)._M_dataplus._M_p,(allocator<char> *)local_268);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_1a8);
  if ((TestMetadata *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198.id._M_dataplus._M_p + 1));
  }
  checkTestable<void(*)(),rc::detail::TestMetadata&>
            ((TestResult *)local_268,(detail *)testable,&local_2a8,args);
  if ((ulong *)local_268._0_8_ == (ulong *)0x0) {
    local_1a8._0_4_ = local_268._8_4_;
    std::
    _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
    ::_Rb_tree((_Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
                *)(local_1a8 + 8),
               (_Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
                *)(local_268 + 0x10));
    if (local_198.description._M_dataplus._M_p != (pointer)0x0) {
      printResultMessage((TestResult *)local_268,(ostream *)&std::cout);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
    }
    std::
    _Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>,_std::less<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_int>_>_>
                 *)(local_1a8 + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    printResultMessage((TestResult *)local_268,(ostream *)local_1a8);
    testing::Message::Message((Message *)&local_2e8);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_2e8._M_head_impl + 0x10),(char *)local_2c8,local_2c0);
    cVar2 = (char)local_2e8._M_head_impl + '\x10';
    std::ios::widen((char)*(undefined8 *)(*(ulong *)(local_2e8._M_head_impl + 0x10) - 0x18) + cVar2)
    ;
    std::ostream::put(cVar2);
    std::ostream::flush();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/rapidcheck/extras/gtest/include/rapidcheck/gtest.h"
               ,0x1d,"Failed");
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if (local_2c8 != local_2b8) {
      operator_delete(local_2c8,local_2b8[0] + 1);
    }
    if (local_2e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(ulong *)local_2e8._M_head_impl + 8))();
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(Variant<rc::detail::SuccessResult,rc::detail::FailureResult,rc::detail::GaveUpResult,rc::detail::Error>
               ::destroy(unsigned_long,void*)::destroyFuncs + local_268._0_8_ * 8))();
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  if (local_2a8 != (_func_void *)&local_298) {
    operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
  }
  return;
}

Assistant:

void checkGTest(Testable &&testable) {
  const auto testInfo = ::testing::UnitTest::GetInstance()->current_test_info();
  TestMetadata metadata;
  metadata.id = std::string(testInfo->test_case_name()) + "/" +
      std::string(testInfo->name());
  metadata.description = std::string(testInfo->name());

  const auto result = checkTestable(std::forward<Testable>(testable), metadata);

  if (result.template is<SuccessResult>()) {
    const auto success = result.template get<SuccessResult>();
    if (!success.distribution.empty()) {
      printResultMessage(result, std::cout);
      std::cout << std::endl;
    }
  } else {
    std::ostringstream ss;
    printResultMessage(result, ss);
    FAIL() << ss.str() << std::endl;
  }
}